

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O0

int ON_BrepExtrudeVertex(ON_Brep *brep,int vertex_index,ON_Curve *path_curve)

{
  ON_3dPoint vertex_point;
  ON_Point *pOVar1;
  ON_BrepVertex *this;
  bool bVar2;
  int iVar3;
  ON_BrepEdge *pOVar4;
  ON_BrepEdge *edge;
  undefined1 local_a0 [4];
  int c3i;
  ON_3dVector local_88;
  ON_3dPoint local_70;
  ON_BrepVertex *local_58;
  ON_BrepVertex *v1;
  ON_BrepVertex *v0;
  ON_Curve *c3;
  ON_3dVector path_vector;
  ON_Curve *path_curve_local;
  int vertex_index_local;
  ON_Brep *brep_local;
  
  path_vector.z = (double)path_curve;
  if ((vertex_index < 0) &&
     (iVar3 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&brep->m_V),
     iVar3 <= vertex_index)) {
    return 0;
  }
  bVar2 = ON_BrepExtrudeHelper_CheckPathCurve((ON_Curve *)path_vector.z,(ON_3dVector *)&c3);
  if (bVar2) {
    v0 = (ON_BrepVertex *)ON_Curve::Duplicate((ON_Curve *)path_vector.z);
    iVar3 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&brep->m_V);
    ON_ClassArray<ON_BrepVertex>::Reserve
              ((ON_ClassArray<ON_BrepVertex> *)&brep->m_V,(long)(iVar3 + 1));
    v1 = ON_ClassArray<ON_BrepVertex>::operator[]
                   ((ON_ClassArray<ON_BrepVertex> *)&brep->m_V,vertex_index);
    ON_3dPoint::operator+(&local_70,&(v1->super_ON_Point).point,(ON_3dVector *)&c3);
    vertex_point.y = local_70.y;
    vertex_point.x = local_70.x;
    vertex_point.z = local_70.z;
    local_58 = ON_Brep::NewVertex(brep,vertex_point,0.0);
    this = v0;
    pOVar1 = &v1->super_ON_Point;
    ON_Curve::PointAtStart((ON_3dPoint *)local_a0,(ON_Curve *)v0);
    ON_3dPoint::operator-(&local_88,&pOVar1->point,(ON_3dPoint *)local_a0);
    ON_Geometry::Translate((ON_Geometry *)this,&local_88);
    iVar3 = ON_Brep::AddEdgeCurve(brep,(ON_Curve *)v0);
    pOVar4 = ON_Brep::NewEdge(brep,v1,local_58,iVar3,(ON_Interval *)0x0,-1.23432101234321e+308);
    pOVar4->m_tolerance = 0.0;
  }
  brep_local._4_4_ = (uint)bVar2;
  return brep_local._4_4_;
}

Assistant:

int ON_BrepExtrudeVertex( 
          ON_Brep& brep,
          int vertex_index,
          const ON_Curve& path_curve
          )
{
  ON_3dVector path_vector;
  if ( vertex_index < 0 && vertex_index >= brep.m_V.Count() )
    return false;
  if ( !ON_BrepExtrudeHelper_CheckPathCurve(path_curve,path_vector) )
    return false;
  ON_Curve* c3 = path_curve.Duplicate();
  brep.m_V.Reserve( brep.m_V.Count() + 1 );
  ON_BrepVertex& v0 = brep.m_V[vertex_index];
  ON_BrepVertex& v1 = brep.NewVertex( v0.point + path_vector, 0.0 );
  c3->Translate( v0.point - c3->PointAtStart() );
  int c3i = brep.AddEdgeCurve( c3 );
  ON_BrepEdge& edge = brep.NewEdge( v0, v1, c3i );
  edge.m_tolerance = 0.0;
  return true;
}